

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

CURLcode Curl_urldecode(Curl_easy *data,char *string,size_t length,char **ostring,size_t *olen,
                       _Bool reject_ctrl)

{
  byte bVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  ulong ulnum;
  byte *pbVar5;
  size_t sVar6;
  size_t sVar8;
  char hexstr [3];
  char *ptr;
  size_t sVar7;
  
  if (length == 0) {
    length = strlen(string);
  }
  pcVar4 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar4 == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar8 = 0;
    sVar7 = length + 1;
    while (sVar6 = sVar7 - 1, sVar6 != 0) {
      bVar1 = *string;
      pbVar5 = (byte *)string;
      if ((sVar6 < 3) || (bVar1 != 0x25)) {
LAB_0011e3c6:
        if ((reject_ctrl) && (bVar1 < 0x20)) {
          (*Curl_cfree)(pcVar4);
          return CURLE_URL_MALFORMAT;
        }
      }
      else {
        iVar2 = Curl_isxdigit((uint)((byte *)string)[1]);
        bVar1 = 0x25;
        if ((iVar2 != 0) && (iVar2 = Curl_isxdigit((uint)((byte *)string)[2]), iVar2 != 0)) {
          pbVar5 = (byte *)string + 2;
          hexstr[0] = ((byte *)string)[1];
          hexstr[1] = ((byte *)string)[2];
          hexstr[2] = '\0';
          ulnum = strtoul(hexstr,&ptr,0x10);
          bVar1 = curlx_ultouc(ulnum);
          sVar6 = sVar7 - 3;
          goto LAB_0011e3c6;
        }
      }
      pcVar4[sVar8] = bVar1;
      sVar8 = sVar8 + 1;
      string = (char *)(pbVar5 + 1);
      sVar7 = sVar6;
    }
    pcVar4[sVar8] = '\0';
    if (olen != (size_t *)0x0) {
      *olen = sVar8;
    }
    *ostring = pcVar4;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_urldecode(struct Curl_easy *data,
                        const char *string, size_t length,
                        char **ostring, size_t *olen,
                        bool reject_ctrl)
{
  size_t alloc = (length?length:strlen(string)) + 1;
  char *ns = malloc(alloc);
  size_t strindex = 0;
  unsigned long hex;
  CURLcode result = CURLE_OK;

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      if(data) {
        result = Curl_convert_from_network(data, (char *)&in, 1);
        if(result) {
          /* Curl_convert_from_network calls failf if unsuccessful */
          free(ns);
          return result;
        }
      }

      string += 2;
      alloc -= 2;
    }

    if(reject_ctrl && (in < 0x20)) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex] = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}